

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

char * __thiscall CServer::ClientClan(CServer *this,int ClientID)

{
  int ClientID_local;
  CServer *this_local;
  char *local_8;
  
  if (((ClientID < 0) || (0x3f < ClientID)) || (this->m_aClients[ClientID].m_State == 0)) {
    local_8 = "";
  }
  else if (this->m_aClients[ClientID].m_State == 5) {
    local_8 = this->m_aClients[ClientID].m_aClan;
  }
  else {
    local_8 = "";
  }
  return local_8;
}

Assistant:

const char *CServer::ClientClan(int ClientID) const
{
	if(ClientID < 0 || ClientID >= MAX_CLIENTS || m_aClients[ClientID].m_State == CServer::CClient::STATE_EMPTY)
		return "";
	if(m_aClients[ClientID].m_State == CServer::CClient::STATE_INGAME)
		return m_aClients[ClientID].m_aClan;
	else
		return "";
}